

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O2

void Ntk_SymFunDeriveNpn(word *pFun,int nVars,int *pComp)

{
  int w;
  int iVar1;
  word *pOut;
  ulong uVar2;
  uint nWords;
  ulong uVar3;
  long lVar4;
  
  nWords = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  pOut = (word *)calloc((long)(int)nWords,8);
  Abc_TtCopy(pOut,pFun,nWords,1);
  iVar1 = Abc_TtCompareRev(pOut,pFun,nWords);
  if (iVar1 == 1) {
    Abc_TtCopy(pOut,pFun,nWords,0);
  }
  lVar4 = 0;
  uVar3 = 0;
  if (0 < (int)nWords) {
    uVar3 = (ulong)nWords;
  }
  for (; lVar4 < 1 << ((byte)nVars & 0x1f); lVar4 = lVar4 + 1) {
    Abc_TtFlip(pFun,nWords,pComp[lVar4]);
    iVar1 = Abc_TtCompareRev(pOut,pFun,nWords);
    if (iVar1 == 1) {
      Abc_TtCopy(pOut,pFun,nWords,0);
    }
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      pFun[uVar2] = ~pFun[uVar2];
    }
    iVar1 = Abc_TtCompareRev(pOut,pFun,nWords);
    if (iVar1 == 1) {
      Abc_TtCopy(pOut,pFun,nWords,0);
    }
  }
  Abc_TtCopy(pFun,pOut,nWords,0);
  free(pOut);
  return;
}

Assistant:

void Ntk_SymFunDeriveNpn( word * pFun, int nVars, int * pComp )
{
    int i, nWords = Abc_TtWordNum(nVars);
    word * pFunB = ABC_CALLOC( word, nWords );
    Abc_TtCopy( pFunB, pFun, nWords, 1 );
    if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
        Abc_TtCopy( pFunB, pFun, nWords, 0 );
    for ( i = 0; i < (1 << nVars); i++ )
    {
        Abc_TtFlip( pFun, nWords, pComp[i] );
        if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
            Abc_TtCopy( pFunB, pFun, nWords, 0 );
        Abc_TtNot( pFun, nWords );
        if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
            Abc_TtCopy( pFunB, pFun, nWords, 0 );
    }
    //Ntk_SymTryRandomFlips( pFun, pFunB, nVars );
    Abc_TtCopy( pFun, pFunB, nWords, 0 );
    ABC_FREE( pFunB );
}